

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_convolve_scale_sse4.c
# Opt level: O0

void vfilter8(int16_t *src,int src_stride,uint8_t *dst,int dst_stride,int w,int h,int subpel_y_qn,
             int y_step_qn,InterpFilterParams *filter_params,ConvolveParams *conv_params,int bd)

{
  undefined8 uVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  byte bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  byte bVar19;
  uint8_t uVar20;
  int iVar21;
  uint uVar22;
  long lVar23;
  int16_t *piVar24;
  int16_t *src_00;
  undefined4 *puVar25;
  undefined8 *puVar26;
  short sVar27;
  int in_ECX;
  int iVar28;
  uint uVar29;
  int iVar30;
  long in_RDX;
  longlong extraout_RDX;
  int in_ESI;
  ulong uVar32;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int iVar33;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qa_02;
  int iVar36;
  int iVar37;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  int iVar38;
  __m128i alVar39;
  __m128i coeff;
  __m128i coeff_00;
  __m128i coeff_01;
  uint in_stack_00000008;
  int in_stack_00000010;
  int32_t tmp_1;
  int32_t tmp;
  CONV_BUF_TYPE res;
  int k;
  int32_t sum;
  int16_t *src_x;
  __m128i result_8_1;
  __m128i subbed_1;
  __m128i result_8;
  __m128i subbed;
  __m128i shifted_32;
  __m128i wt_res_lo;
  __m128i p_16_lo;
  __m128i p_16;
  CONV_BUF_TYPE *dst_16_x;
  __m128i shifted_16;
  __m128i result;
  uint8_t *dst_x;
  __m128i shifted;
  __m128i conv;
  __m128i conv23;
  __m128i conv01;
  __m128i conv3;
  __m128i conv2;
  __m128i conv1;
  __m128i conv0;
  int16_t *src3;
  int16_t *src2;
  int16_t *src1;
  int16_t *src0;
  int x;
  __m128i coeff0716;
  int16_t *filter;
  int filter_idx;
  int16_t *src_y;
  int y;
  int y_qn;
  __m128i wt;
  __m128i wt1;
  __m128i wt0;
  int w1;
  int w0;
  __m128i res_add_const;
  __m128i round_shift_add;
  __m128i bits_const;
  __m128i bits_shift;
  int bits;
  int dst16_stride;
  CONV_BUF_TYPE *dst16;
  __m128i sub;
  int32_t sub32;
  __m128i round_shift;
  int ntaps;
  int offset_bits;
  int local_710;
  int local_708;
  int local_704;
  undefined1 local_668 [16];
  int local_58c;
  int local_560;
  uint local_55c;
  undefined2 local_520;
  undefined2 local_51c;
  byte local_4d8;
  short local_4ac;
  ulong local_458;
  int local_328;
  int iStack_324;
  int iStack_320;
  int iStack_31c;
  short local_258;
  short sStack_256;
  short sStack_254;
  short sStack_252;
  int local_218;
  int iStack_214;
  int iStack_210;
  int iStack_20c;
  short local_178;
  short sStack_176;
  short sStack_174;
  short sStack_172;
  short sStack_170;
  short sStack_16e;
  short sStack_16c;
  short sStack_16a;
  short local_158;
  short sStack_156;
  short sStack_154;
  short sStack_152;
  short sStack_150;
  short sStack_14e;
  short sStack_14c;
  short sStack_14a;
  short local_f8;
  short sStack_f6;
  short sStack_f4;
  short sStack_f2;
  short local_d8;
  short sStack_d6;
  short sStack_d4;
  short sStack_d2;
  longlong lVar31;
  
  bVar5 = ((char)src_x - (char)_k[5]) + 0xe;
  uVar2 = _k[6];
  bVar19 = bVar5 - (char)_k[6];
  iVar28 = (1 << (bVar19 & 0x1f)) + (1 << (bVar19 - 1 & 0x1f));
  local_4ac = (short)iVar28;
  lVar4 = *(long *)(_k + 2);
  iVar3 = _k[4];
  uVar29 = 0xe - (_k[5] + _k[6]);
  local_458 = CONCAT44(0,uVar29);
  local_4d8 = (byte)uVar29;
  sVar27 = (short)((uint)(1 << (local_4d8 & 0x1f)) >> 1);
  iVar30 = (1 << (*(byte *)(_k + 6) & 0x1f)) >> 1;
  iVar21 = 1 << (bVar5 & 0x1f);
  local_51c = (undefined2)_k[10];
  local_520 = (undefined2)_k[0xb];
  local_55c = in_stack_00000008;
  for (local_560 = 0; local_560 < in_R9D; local_560 = local_560 + 1) {
    lVar23 = in_RDI + (long)((int)local_55c >> 10) * 2;
    uVar29 = (int)(local_55c & 0x3ff) >> 6;
    uVar32 = (ulong)uVar29;
    piVar24 = av1_get_interp_filter_subpel_kernel(_tmp,uVar29);
    lVar31 = extraout_RDX;
    for (local_58c = 0; local_58c <= in_R8D + -4; local_58c = local_58c + 4) {
      src_00 = (int16_t *)(lVar23 + (long)(local_58c * in_ESI) * 2);
      alVar39[1] = lVar31;
      alVar39[0] = uVar32;
      alVar39 = convolve_16_8(src_00,alVar39);
      coeff[1] = alVar39[1];
      coeff[0] = uVar32;
      alVar39 = convolve_16_8(src_00 + in_ESI,coeff);
      coeff_00[1] = alVar39[1];
      coeff_00[0] = uVar32;
      alVar39 = convolve_16_8(src_00 + (in_ESI << 1),coeff_00);
      coeff_01[1] = alVar39[1];
      coeff_01[0] = uVar32;
      alVar39 = convolve_16_8(src_00 + in_ESI * 3,coeff_01);
      lVar31 = alVar39[1];
      auVar9._8_8_ = extraout_XMM0_Qb;
      auVar9._0_8_ = extraout_XMM0_Qa;
      auVar34._8_8_ = extraout_XMM0_Qb_00;
      auVar34._0_8_ = extraout_XMM0_Qa_00;
      auVar34 = phaddd(auVar9,auVar34);
      auVar8._8_8_ = extraout_XMM0_Qb_01;
      auVar8._0_8_ = extraout_XMM0_Qa_01;
      auVar35._8_8_ = extraout_XMM0_Qb_02;
      auVar35._0_8_ = extraout_XMM0_Qa_02;
      auVar35 = phaddd(auVar8,auVar35);
      auVar35 = phaddd(auVar34,auVar35);
      local_328 = auVar35._0_4_;
      iStack_324 = auVar35._4_4_;
      iStack_320 = auVar35._8_4_;
      iStack_31c = auVar35._12_4_;
      auVar35 = ZEXT416(uVar2);
      iVar33 = local_328 + iVar21 + iVar30 >> auVar35;
      iVar36 = iStack_324 + iVar21 + iVar30 >> auVar35;
      iVar37 = iStack_320 + iVar21 + iVar30 >> auVar35;
      iVar38 = iStack_31c + iVar21 + iVar30 >> auVar35;
      puVar25 = (undefined4 *)(in_RDX + local_560 * in_ECX + (long)local_58c);
      auVar13._4_4_ = iVar36;
      auVar13._0_4_ = iVar33;
      auVar13._12_4_ = iVar38;
      auVar13._8_4_ = iVar37;
      auVar12._4_4_ = iVar36;
      auVar12._0_4_ = iVar33;
      auVar12._12_4_ = iVar38;
      auVar12._8_4_ = iVar37;
      auVar35 = packusdw(auVar13,auVar12);
      local_668._0_8_ = auVar35._0_8_;
      local_178 = auVar35._0_2_;
      sStack_176 = auVar35._2_2_;
      sStack_174 = auVar35._4_2_;
      sStack_172 = auVar35._6_2_;
      sStack_170 = auVar35._8_2_;
      sStack_16e = auVar35._10_2_;
      sStack_16c = auVar35._12_2_;
      sStack_16a = auVar35._14_2_;
      if (_k[8] == 0) {
        auVar16._2_2_ = (sStack_176 - local_4ac) + sVar27;
        auVar16._0_2_ = (local_178 - local_4ac) + sVar27;
        auVar16._4_2_ = (sStack_174 - local_4ac) + sVar27;
        auVar16._6_2_ = (sStack_172 - local_4ac) + sVar27;
        auVar16._8_2_ = (sStack_170 - local_4ac) + sVar27;
        auVar16._10_2_ = (sStack_16e - local_4ac) + sVar27;
        auVar16._12_2_ = (sStack_16c - local_4ac) + sVar27;
        auVar16._14_2_ = (sStack_16a - local_4ac) + sVar27;
        auVar15._8_8_ = 0;
        auVar15._0_8_ = local_458;
        auVar35 = psraw(auVar16,auVar15);
        local_f8 = auVar35._0_2_;
        sStack_f6 = auVar35._2_2_;
        sStack_f4 = auVar35._4_2_;
        sStack_f2 = auVar35._6_2_;
        *puVar25 = CONCAT13((0 < sStack_f2) * (sStack_f2 < 0x100) * auVar35[6] - (0xff < sStack_f2),
                            CONCAT12((0 < sStack_f4) * (sStack_f4 < 0x100) * auVar35[4] -
                                     (0xff < sStack_f4),
                                     CONCAT11((0 < sStack_f6) * (sStack_f6 < 0x100) * auVar35[2] -
                                              (0xff < sStack_f6),
                                              (0 < local_f8) * (local_f8 < 0x100) * auVar35[0] -
                                              (0xff < local_f8))));
      }
      else {
        puVar26 = (undefined8 *)(lVar4 + (long)(local_560 * iVar3) * 2 + (long)local_58c * 2);
        if (*_k == 0) {
          *puVar26 = local_668._0_8_;
        }
        else {
          uVar1 = *puVar26;
          local_258 = (short)uVar1;
          sStack_256 = (short)((ulong)uVar1 >> 0x10);
          sStack_254 = (short)((ulong)uVar1 >> 0x20);
          sStack_252 = (short)((ulong)uVar1 >> 0x30);
          if (_k[9] == 0) {
            auVar14._2_2_ = sStack_256 + sStack_176;
            auVar14._0_2_ = local_258 + local_178;
            auVar14._4_2_ = sStack_254 + sStack_174;
            auVar14._6_2_ = sStack_252 + sStack_172;
            auVar14._8_2_ = sStack_170;
            auVar14._10_2_ = sStack_16e;
            auVar14._12_2_ = sStack_16c;
            auVar14._14_2_ = sStack_16a;
            local_668 = psraw(auVar14,ZEXT416(1));
          }
          else {
            auVar7._2_2_ = local_178;
            auVar7._0_2_ = local_258;
            auVar7._4_2_ = sStack_256;
            auVar7._6_2_ = sStack_176;
            auVar7._10_2_ = sStack_174;
            auVar7._8_2_ = sStack_254;
            auVar7._12_2_ = sStack_252;
            auVar7._14_2_ = sStack_172;
            auVar6._2_2_ = local_520;
            auVar6._0_2_ = local_51c;
            auVar6._4_2_ = local_51c;
            auVar6._6_2_ = local_520;
            auVar6._10_2_ = local_520;
            auVar6._8_2_ = local_51c;
            auVar6._12_2_ = local_51c;
            auVar6._14_2_ = local_520;
            auVar35 = pmaddwd(auVar7,auVar6);
            local_218 = auVar35._0_4_;
            iStack_214 = auVar35._4_4_;
            iStack_210 = auVar35._8_4_;
            iStack_20c = auVar35._12_4_;
            auVar35 = ZEXT416(4);
            auVar11._4_4_ = iStack_214 >> auVar35;
            auVar11._0_4_ = local_218 >> auVar35;
            auVar11._12_4_ = iStack_20c >> auVar35;
            auVar11._8_4_ = iStack_210 >> auVar35;
            auVar10._4_4_ = iStack_214 >> auVar35;
            auVar10._0_4_ = local_218 >> auVar35;
            auVar10._12_4_ = iStack_20c >> auVar35;
            auVar10._8_4_ = iStack_210 >> auVar35;
            local_668 = packusdw(auVar11,auVar10);
          }
          local_158 = local_668._0_2_;
          sStack_156 = local_668._2_2_;
          sStack_154 = local_668._4_2_;
          sStack_152 = local_668._6_2_;
          sStack_150 = local_668._8_2_;
          sStack_14e = local_668._10_2_;
          sStack_14c = local_668._12_2_;
          sStack_14a = local_668._14_2_;
          auVar18._2_2_ = (sStack_156 - local_4ac) + sVar27;
          auVar18._0_2_ = (local_158 - local_4ac) + sVar27;
          auVar18._4_2_ = (sStack_154 - local_4ac) + sVar27;
          auVar18._6_2_ = (sStack_152 - local_4ac) + sVar27;
          auVar18._8_2_ = (sStack_150 - local_4ac) + sVar27;
          auVar18._10_2_ = (sStack_14e - local_4ac) + sVar27;
          auVar18._12_2_ = (sStack_14c - local_4ac) + sVar27;
          auVar18._14_2_ = (sStack_14a - local_4ac) + sVar27;
          auVar17._8_8_ = 0;
          auVar17._0_8_ = local_458;
          auVar35 = psraw(auVar18,auVar17);
          local_d8 = auVar35._0_2_;
          sStack_d6 = auVar35._2_2_;
          sStack_d4 = auVar35._4_2_;
          sStack_d2 = auVar35._6_2_;
          *puVar25 = CONCAT13((0 < sStack_d2) * (sStack_d2 < 0x100) * auVar35[6] -
                              (0xff < sStack_d2),
                              CONCAT12((0 < sStack_d4) * (sStack_d4 < 0x100) * auVar35[4] -
                                       (0xff < sStack_d4),
                                       CONCAT11((0 < sStack_d6) * (sStack_d6 < 0x100) * auVar35[2] -
                                                (0xff < sStack_d6),
                                                (0 < local_d8) * (local_d8 < 0x100) * auVar35[0] -
                                                (0xff < local_d8))));
        }
      }
    }
    for (; local_58c < in_R8D; local_58c = local_58c + 1) {
      local_704 = 1 << (bVar5 & 0x1f);
      for (local_708 = 0; local_708 < 8; local_708 = local_708 + 1) {
        local_704 = (int)piVar24[local_708] *
                    (int)*(short *)(lVar23 + (long)(local_58c * in_ESI) * 2 + (long)local_708 * 2) +
                    local_704;
      }
      uVar29 = local_704 + ((1 << ((byte)_k[6] & 0x1f)) >> 1) >> ((byte)_k[6] & 0x1f);
      if (_k[8] == 0) {
        uVar20 = clip_pixel((int)(((uVar29 & 0xffff) -
                                  ((1 << (bVar5 - (char)_k[6] & 0x1f)) +
                                  (1 << ((bVar5 - (char)_k[6]) - 1 & 0x1f)))) +
                                 ((1 << (local_4d8 & 0x1f)) >> 1)) >> (local_4d8 & 0x1f));
        *(uint8_t *)(in_RDX + (local_560 * in_ECX + local_58c)) = uVar20;
      }
      else if (*_k == 0) {
        *(short *)(lVar4 + (long)(local_560 * iVar3 + local_58c) * 2) = (short)uVar29;
      }
      else {
        uVar22 = (uint)*(ushort *)(lVar4 + (long)(local_560 * iVar3 + local_58c) * 2);
        if (_k[9] == 0) {
          local_710 = (int)((uVar29 & 0xffff) + uVar22) >> 1;
        }
        else {
          local_710 = (int)(uVar22 * _k[10] + (uVar29 & 0xffff) * _k[0xb]) >> 4;
        }
        uVar20 = clip_pixel((local_710 - iVar28) + ((1 << (local_4d8 & 0x1f)) >> 1) >>
                            (local_4d8 & 0x1f));
        *(uint8_t *)(in_RDX + (local_560 * in_ECX + local_58c)) = uVar20;
      }
    }
    local_55c = in_stack_00000010 + local_55c;
  }
  return;
}

Assistant:

static void vfilter8(const int16_t *src, int src_stride, uint8_t *dst,
                     int dst_stride, int w, int h, int subpel_y_qn,
                     int y_step_qn, const InterpFilterParams *filter_params,
                     const ConvolveParams *conv_params, int bd) {
  const int offset_bits = bd + 2 * FILTER_BITS - conv_params->round_0;
  const int ntaps = 8;

  const __m128i round_shift = _mm_cvtsi32_si128(conv_params->round_1);

  const int32_t sub32 = ((1 << (offset_bits - conv_params->round_1)) +
                         (1 << (offset_bits - conv_params->round_1 - 1)));
  const __m128i sub = _mm_set1_epi16(sub32);

  CONV_BUF_TYPE *dst16 = conv_params->dst;
  const int dst16_stride = conv_params->dst_stride;
  const int bits =
      FILTER_BITS * 2 - conv_params->round_0 - conv_params->round_1;
  const __m128i bits_shift = _mm_cvtsi32_si128(bits);
  const __m128i bits_const = _mm_set1_epi16(((1 << bits) >> 1));
  const __m128i round_shift_add =
      _mm_set1_epi32(((1 << conv_params->round_1) >> 1));
  const __m128i res_add_const = _mm_set1_epi32(1 << offset_bits);

  const int w0 = conv_params->fwd_offset;
  const int w1 = conv_params->bck_offset;
  const __m128i wt0 = _mm_set1_epi16((short)w0);
  const __m128i wt1 = _mm_set1_epi16((short)w1);
  const __m128i wt = _mm_unpacklo_epi16(wt0, wt1);

  int y_qn = subpel_y_qn;
  for (int y = 0; y < h; ++y, y_qn += y_step_qn) {
    const int16_t *src_y = src + (y_qn >> SCALE_SUBPEL_BITS);
    const int filter_idx = (y_qn & SCALE_SUBPEL_MASK) >> SCALE_EXTRA_BITS;
    assert(filter_idx < SUBPEL_SHIFTS);
    const int16_t *filter =
        av1_get_interp_filter_subpel_kernel(filter_params, filter_idx);

    const __m128i coeff0716 = _mm_loadu_si128((__m128i *)filter);
    int x;
    for (x = 0; x <= w - 4; x += 4) {
      const int16_t *const src0 = src_y + x * src_stride;
      const int16_t *const src1 = src0 + 1 * src_stride;
      const int16_t *const src2 = src0 + 2 * src_stride;
      const int16_t *const src3 = src0 + 3 * src_stride;

      // Load the source data for the three rows, adding the three registers of
      // convolved products to one as we go (conv0..conv3) to avoid the
      // register pressure getting too high.
      const __m128i conv0 = convolve_16_8(src0, coeff0716);
      const __m128i conv1 = convolve_16_8(src1, coeff0716);
      const __m128i conv2 = convolve_16_8(src2, coeff0716);
      const __m128i conv3 = convolve_16_8(src3, coeff0716);

      // Now reduce horizontally to get one lane for each result
      const __m128i conv01 = _mm_hadd_epi32(conv0, conv1);
      const __m128i conv23 = _mm_hadd_epi32(conv2, conv3);
      __m128i conv = _mm_hadd_epi32(conv01, conv23);

      conv = _mm_add_epi32(conv, res_add_const);
      // Divide down by (1 << round_1), rounding to nearest and subtract sub32.
      __m128i shifted =
          _mm_sra_epi32(_mm_add_epi32(conv, round_shift_add), round_shift);

      uint8_t *dst_x = dst + y * dst_stride + x;
      __m128i result;
      __m128i shifted_16 = _mm_packus_epi32(shifted, shifted);

      if (conv_params->is_compound) {
        CONV_BUF_TYPE *dst_16_x = dst16 + y * dst16_stride + x;
        if (conv_params->do_average) {
          const __m128i p_16 = _mm_loadl_epi64((__m128i *)dst_16_x);
          if (conv_params->use_dist_wtd_comp_avg) {
            const __m128i p_16_lo = _mm_unpacklo_epi16(p_16, shifted_16);
            const __m128i wt_res_lo = _mm_madd_epi16(p_16_lo, wt);
            const __m128i shifted_32 =
                _mm_srai_epi32(wt_res_lo, DIST_PRECISION_BITS);
            shifted_16 = _mm_packus_epi32(shifted_32, shifted_32);
          } else {
            shifted_16 = _mm_srai_epi16(_mm_add_epi16(p_16, shifted_16), 1);
          }
          const __m128i subbed = _mm_sub_epi16(shifted_16, sub);
          result = _mm_sra_epi16(_mm_add_epi16(subbed, bits_const), bits_shift);
          const __m128i result_8 = _mm_packus_epi16(result, result);
          *(int *)dst_x = _mm_cvtsi128_si32(result_8);
        } else {
          _mm_storel_epi64((__m128i *)dst_16_x, shifted_16);
        }
      } else {
        const __m128i subbed = _mm_sub_epi16(shifted_16, sub);
        result = _mm_sra_epi16(_mm_add_epi16(subbed, bits_const), bits_shift);
        const __m128i result_8 = _mm_packus_epi16(result, result);
        *(int *)dst_x = _mm_cvtsi128_si32(result_8);
      }
    }
    for (; x < w; ++x) {
      const int16_t *src_x = src_y + x * src_stride;
      int32_t sum = 1 << offset_bits;
      for (int k = 0; k < ntaps; ++k) sum += filter[k] * src_x[k];
      CONV_BUF_TYPE res = ROUND_POWER_OF_TWO(sum, conv_params->round_1);

      if (conv_params->is_compound) {
        if (conv_params->do_average) {
          int32_t tmp = dst16[y * dst16_stride + x];
          if (conv_params->use_dist_wtd_comp_avg) {
            tmp = tmp * conv_params->fwd_offset + res * conv_params->bck_offset;
            tmp = tmp >> DIST_PRECISION_BITS;
          } else {
            tmp += res;
            tmp = tmp >> 1;
          }
          /* Subtract round offset and convolve round */
          tmp = tmp - sub32;
          dst[y * dst_stride + x] = clip_pixel(ROUND_POWER_OF_TWO(tmp, bits));
        } else {
          dst16[y * dst16_stride + x] = res;
        }
      } else {
        /* Subtract round offset and convolve round */
        int32_t tmp = res - ((1 << (offset_bits - conv_params->round_1)) +
                             (1 << (offset_bits - conv_params->round_1 - 1)));
        dst[y * dst_stride + x] = clip_pixel(ROUND_POWER_OF_TWO(tmp, bits));
      }
    }
  }
}